

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_pcm.cpp
# Opt level: O0

void __thiscall ymfm::pcm_channel::load_wavetable(pcm_channel *this)

{
  pcm_engine *ppVar1;
  byte bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  size_t __n;
  uint32_t uStack_18;
  uint8_t byte;
  uint32_t bank;
  uint32_t wavheader;
  uint32_t wavnum;
  pcm_channel *this_local;
  
  uVar3 = pcm_registers::ch_wave_table_num(this->m_regs,this->m_choffs);
  uStack_18 = uVar3 * 0xc;
  if ((0x17f < uVar3) && (uVar4 = pcm_registers::wave_table_header(this->m_regs), uVar4 != 0)) {
    uStack_18 = uVar4 * 0x80000 + (uVar3 - 0x180) * 0xc;
  }
  bVar2 = read_pcm(this,uStack_18);
  uVar3 = bitfield((uint)bVar2,6,2);
  __n = (size_t)uVar3;
  this->m_format = (uint8_t)uVar3;
  uVar3 = bitfield((uint)bVar2,0,6);
  this->m_baseaddr = uVar3 << 0x10;
  bVar2 = read_pcm(this,uStack_18 + 1);
  this->m_baseaddr = (uint)bVar2 << 8 | this->m_baseaddr;
  bVar2 = read_pcm(this,uStack_18 + 2);
  this->m_baseaddr = (uint)bVar2 | this->m_baseaddr;
  bVar2 = read_pcm(this,uStack_18 + 3);
  this->m_looppos = (uint)bVar2 << 8;
  bVar2 = read_pcm(this,uStack_18 + 4);
  this->m_looppos = (uint)bVar2 | this->m_looppos;
  this->m_looppos = this->m_looppos << 0x10;
  bVar2 = read_pcm(this,uStack_18 + 5);
  this->m_endpos = (uint)bVar2 << 8;
  bVar2 = read_pcm(this,uStack_18 + 6);
  this->m_endpos = (uint)bVar2 | this->m_endpos;
  this->m_endpos = this->m_endpos * -0x10000;
  ppVar1 = this->m_owner;
  uVar3 = this->m_choffs;
  bVar2 = read_pcm(this,uStack_18 + 7);
  pcm_engine::write(ppVar1,uVar3 + 0x80,(void *)(ulong)bVar2,__n);
  ppVar1 = this->m_owner;
  uVar3 = this->m_choffs;
  bVar2 = read_pcm(this,uStack_18 + 8);
  pcm_engine::write(ppVar1,uVar3 + 0x98,(void *)(ulong)bVar2,__n);
  ppVar1 = this->m_owner;
  uVar3 = this->m_choffs;
  bVar2 = read_pcm(this,uStack_18 + 9);
  pcm_engine::write(ppVar1,uVar3 + 0xb0,(void *)(ulong)bVar2,__n);
  ppVar1 = this->m_owner;
  uVar3 = this->m_choffs;
  bVar2 = read_pcm(this,uStack_18 + 10);
  pcm_engine::write(ppVar1,uVar3 + 200,(void *)(ulong)bVar2,__n);
  ppVar1 = this->m_owner;
  uVar3 = this->m_choffs;
  bVar2 = read_pcm(this,uStack_18 + 0xb);
  pcm_engine::write(ppVar1,uVar3 + 0xe0,(void *)(ulong)bVar2,__n);
  this->m_env_attenuation = 0x3ff;
  return;
}

Assistant:

void pcm_channel::load_wavetable()
{
	// determine the address of the wave table header
	uint32_t wavnum = m_regs.ch_wave_table_num(m_choffs);
	uint32_t wavheader = 12 * wavnum;

	// above 384 it may be in a different bank
	if (wavnum >= 384)
	{
		uint32_t bank = m_regs.wave_table_header();
		if (bank != 0)
			wavheader = 512*1024 * bank + (wavnum - 384) * 12;
	}

	// fetch the 22-bit base address and 2-bit format
	uint8_t byte = read_pcm(wavheader + 0);
	m_format = bitfield(byte, 6, 2);
	m_baseaddr = bitfield(byte, 0, 6) << 16;
	m_baseaddr |= read_pcm(wavheader + 1) << 8;
	m_baseaddr |= read_pcm(wavheader + 2) << 0;

	// fetch the 16-bit loop position
	m_looppos = read_pcm(wavheader + 3) << 8;
	m_looppos |= read_pcm(wavheader + 4);
	m_looppos <<= 16;

	// fetch the 16-bit end position, which is stored as a negative value
	// for some reason that is unclear
	m_endpos = read_pcm(wavheader + 5) << 8;
	m_endpos |= read_pcm(wavheader + 6);
	m_endpos = -int32_t(m_endpos) << 16;

	// remaining data values set registers
	m_owner.write(0x80 + m_choffs, read_pcm(wavheader + 7));
	m_owner.write(0x98 + m_choffs, read_pcm(wavheader + 8));
	m_owner.write(0xb0 + m_choffs, read_pcm(wavheader + 9));
	m_owner.write(0xc8 + m_choffs, read_pcm(wavheader + 10));
	m_owner.write(0xe0 + m_choffs, read_pcm(wavheader + 11));

	// reset the envelope so we don't continue playing mid-sample from previous key ons
	m_env_attenuation = 0x3ff;
}